

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int sat_solver2_addclause(sat_solver2 *s,lit *begin,lit *end,int Id)

{
  uint *end_00;
  uint *puVar1;
  char cVar2;
  uint uVar3;
  uint *begin_00;
  int iVar4;
  uint *puVar5;
  clause *pcVar6;
  long lVar7;
  uint *puVar8;
  uint *end_01;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  if ((s->trail_lim).size != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50d,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (Id == 0) {
    __assert_fail("Id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50e,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  veci_resize(&s->temp_clause,0);
  for (; begin < end; begin = begin + 1) {
    veci_push(&s->temp_clause,*begin);
  }
  begin_00 = (uint *)(s->temp_clause).ptr;
  end_01 = begin_00 + (s->temp_clause).size;
  iVar10 = (int)*begin_00 >> 1;
  end_00 = begin_00 + 1;
  for (puVar5 = end_00; puVar5 < end_01; puVar5 = puVar5 + 1) {
    uVar11 = *puVar5;
    puVar8 = puVar5;
    if (iVar10 < (int)uVar11 >> 1) {
      iVar10 = (int)uVar11 >> 1;
    }
    for (; (begin_00 < puVar8 && ((int)uVar11 < (int)puVar8[-1])); puVar8 = puVar8 + -1) {
      *puVar8 = puVar8[-1];
    }
    *puVar8 = uVar11;
  }
  sat_solver2_setnvars(s,iVar10 + 1);
  puVar8 = end_00;
  for (puVar5 = end_00; puVar5 < end_01; puVar5 = puVar5 + 1) {
    uVar11 = *puVar5;
    if ((uVar11 ^ puVar5[-1]) == 1) goto LAB_0071349d;
    if (puVar5[-1] != uVar11) {
      *puVar8 = uVar11;
      puVar8 = puVar8 + 1;
    }
  }
  if (puVar8 <= begin_00) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x52c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  lVar7 = 0;
  uVar11 = 0;
  puVar5 = (uint *)0x0;
  while( true ) {
    puVar1 = (uint *)((long)begin_00 + lVar7);
    if (puVar8 <= puVar1) {
      uVar9 = (long)puVar8 - (long)begin_00 >> 2;
      if ((long)uVar9 <= (long)(ulong)uVar11) {
        __assert_fail("count < end-begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x53c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
      }
      uVar3 = *puVar5;
      *puVar5 = *begin_00;
      *begin_00 = uVar3;
      iVar10 = clause2_create_new(s,(lit *)begin_00,(lit *)puVar8,0,0);
      pcVar6 = Sat_MemClauseHand(&s->Mem,iVar10);
      pcVar6[(ulong)((uint)*pcVar6 >> 0xb) + 1] = (clause)Id;
      if ((uVar9 == uVar11 + 1) && (s->fProofLogging != 0)) {
        if (uVar11 == 0) {
          var_set_unit_clause(s,(int)*begin_00 >> 1,iVar10);
          iVar4 = solver2_enqueue(s,*begin_00,0);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                          ,0x551,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
          }
        }
        else {
          pcVar6 = Sat_MemClauseHand(&s->Mem,iVar10);
          proof_chain_start(s,pcVar6);
          for (uVar9 = 1; (uVar9 < (uint)*pcVar6 >> 0xb && (1 < (uint)pcVar6[uVar9 + 1]));
              uVar9 = uVar9 + 1) {
            proof_chain_resolve(s,(clause *)0x0,(int)pcVar6[uVar9 + 1] >> 1);
          }
          iVar4 = proof_chain_stop(s);
          iVar4 = clause2_create_new(s,(lit *)begin_00,(lit *)end_00,1,iVar4);
          var_set_unit_clause(s,(int)*begin_00 >> 1,iVar4);
          iVar4 = solver2_enqueue(s,*begin_00,iVar10);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                          ,0x560,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
          }
        }
      }
      return iVar10;
    }
    uVar3 = *puVar1;
    if ((lVar7 != 0) && ((*(uint *)((long)begin_00 + lVar7 + -4) ^ uVar3) < 2)) {
      __assert_fail("i == begin || lit_var(*(i-1)) != lit_var(*i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x533,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
    }
    cVar2 = s->assigns[(int)uVar3 >> 1];
    end_01 = puVar8;
    if ((uVar3 & 1) == (int)cVar2) break;
    if (cVar2 == '\x03') {
      puVar5 = puVar1;
    }
    uVar11 = uVar11 + (cVar2 != '\x03');
    lVar7 = lVar7 + 4;
  }
LAB_0071349d:
  iVar10 = clause2_create_new(s,(lit *)begin_00,(lit *)end_01,0,0);
  return iVar10;
}

Assistant:

int sat_solver2_addclause(sat_solver2* s, lit* begin, lit* end, int Id)
{
    cla Cid;
    lit *i,*j,*iFree = NULL;
    int maxvar, count, temp;
    assert( solver2_dlevel(s) == 0 );
    assert( begin < end );
    assert( Id != 0 );

    // copy clause into storage
    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver2_setnvars(s,maxvar+1);


    // delete duplicates
    for (i = j = begin + 1; i < end; i++)
    {
        if ( *(i-1) == lit_neg(*i) ) // tautology
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( *(i-1) != *i )
            *j++ = *i;
    }
    end = j;
    assert( begin < end );

    // coount the number of 0-literals
    count = 0;
    for ( i = begin; i < end; i++ )
    {
        // make sure all literals are unique
        assert( i == begin || lit_var(*(i-1)) != lit_var(*i) );
        // consider the value of this literal
        if ( var_value(s, lit_var(*i)) == lit_sign(*i) ) // this clause is always true
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( var_value(s, lit_var(*i)) == varX ) // unassigned literal
            iFree = i;
        else
            count++; // literal is 0
    }
    assert( count < end-begin ); // the clause cannot be UNSAT

    // swap variables to make sure the clause is watched using unassigned variable
    temp   = *iFree;
    *iFree = *begin;
    *begin = temp;

    // create a new clause
    Cid = clause2_create_new( s, begin, end, 0, 0 );
    if ( Id )
        clause2_set_id( s, Cid, Id );

    // handle unit clause
    if ( count+1 == end-begin )
    {
        if ( s->fProofLogging )
        {
            if ( count == 0 ) // original learned clause
            {
                var_set_unit_clause( s, lit_var(begin[0]), Cid );
                if ( !solver2_enqueue(s,begin[0],0) )
                    assert( 0 );
            }
            else
            {
                // Log production of top-level unit clause:
                int x, k, proof_id, CidNew;
                clause* c = clause2_read(s, Cid);
                proof_chain_start( s, c );
                clause_foreach_var( c, x, k, 1 )
                    proof_chain_resolve( s, NULL, x );
                proof_id = proof_chain_stop( s );
                // generate a new clause
                CidNew = clause2_create_new( s, begin, begin+1, 1, proof_id );
                var_set_unit_clause( s, lit_var(begin[0]), CidNew );
                if ( !solver2_enqueue(s,begin[0],Cid) )
                    assert( 0 );
            }
        }
    }
    return Cid;
}